

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O3

AspifOutput * __thiscall Potassco::AspifOutput::add(AspifOutput *this,AtomSpan *atoms)

{
  ostream *poVar1;
  uint *puVar2;
  
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (atoms->size != 0) {
    puVar2 = atoms->first;
    do {
      poVar1 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      puVar2 = puVar2 + 1;
    } while (puVar2 != atoms->first + atoms->size);
  }
  return this;
}

Assistant:

AspifOutput& AspifOutput::add(const AtomSpan& atoms) {
	os_ << " " << size(atoms);
	for (const Atom_t* x = begin(atoms); x != end(atoms); ++x) { os_ << " " << *x; }
	return *this;
}